

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
::operator()(build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>,_3UL>
             *this,space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                   space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_5)

{
  vector<int,_std::allocator<int>_> *this_00;
  node_type *pnVar1;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_RCX;
  undefined8 in_RDX;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
  *in_RSI;
  kd_tree_data_type *in_RDI;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_R8;
  node_type *root_node;
  node_allocator_type allocator;
  box_type root_box;
  vector<int,_std::allocator<int>_> indices;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  space_type *space_00;
  kd_tree_data_type *pkVar2;
  kd_tree_data_type *root_box_00;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int *local_70;
  int *local_68;
  space_type local_48 [4];
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *local_28;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *local_20;
  undefined8 local_10;
  
  root_box_00 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RDX;
  space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
  size((space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
        *)0x1035de);
  std::allocator<int>::allocator((allocator<int> *)0x1035f5);
  std::vector<int,_std::allocator<int>_>::vector
            (&in_RDI->indices,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::allocator<int>::~allocator((allocator<int> *)0x10361b);
  space_00 = local_48;
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffec8._M_current);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              (in_stack_fffffffffffffec8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0);
  splitter_start_bounds_t<pico_tree::bounds_from_space_t>::derived(local_28);
  box_from_bounds<pico_tree::internal::space_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
            ((build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>,_3UL>
              *)&local_88,in_RSI,local_10);
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL> *)
             in_stack_fffffffffffffed0._M_current);
  this_00 = (vector<int,_std::allocator<int>_> *)
            splitter_stop_condition_t<pico_tree::max_leaf_size_t>::derived(local_20);
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
  ::build_kd_tree_impl
            ((build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
              *)in_RDI,space_00,(size_type)this_00,in_stack_fffffffffffffed8,
             (node_allocator_type *)in_stack_fffffffffffffed0._M_current);
  pnVar1 = build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
           ::operator()(in_RSI,(box_type *)root_box_00);
  pkVar2 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (&in_RDI->indices,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8._M_current);
  *(undefined8 *)((pkVar2->root_box).storage_.coords_max._M_elems + 1) = local_78;
  *(undefined8 *)(pkVar2->root_box).storage_.coords_min._M_elems = local_88;
  *(undefined8 *)((pkVar2->root_box).storage_.coords_min._M_elems + 2) = uStack_80;
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL> *)
             in_RDI,(chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>
                     *)in_stack_fffffffffffffec8._M_current);
  pkVar2->root_node = pnVar1;
  chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::~chunk_allocator
            ((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL> *)
             0x103772);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return root_box_00;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }